

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_compact.cpp
# Opt level: O0

UChar * __thiscall
icu_63::number::impl::CompactData::getPattern(CompactData *this,int32_t magnitude,Form plural)

{
  int32_t iVar1;
  CompactData *local_28;
  UChar *patternString;
  Form plural_local;
  int32_t magnitude_local;
  CompactData *this_local;
  
  if (magnitude < 0) {
    this_local = (CompactData *)0x0;
  }
  else {
    patternString._4_4_ = magnitude;
    if (this->largestMagnitude < magnitude) {
      patternString._4_4_ = (int32_t)this->largestMagnitude;
    }
    iVar1 = anon_unknown.dwarf_19dcfe::getIndex(patternString._4_4_,plural);
    local_28 = (CompactData *)this->patterns[iVar1];
    if ((local_28 == (CompactData *)0x0) && (plural != OTHER)) {
      iVar1 = anon_unknown.dwarf_19dcfe::getIndex(patternString._4_4_,OTHER);
      local_28 = (CompactData *)this->patterns[iVar1];
    }
    if (local_28 == (CompactData *)::(anonymous_namespace)::USE_FALLBACK) {
      local_28 = (CompactData *)0x0;
    }
    this_local = local_28;
  }
  return (UChar *)this_local;
}

Assistant:

const UChar *CompactData::getPattern(int32_t magnitude, StandardPlural::Form plural) const {
    if (magnitude < 0) {
        return nullptr;
    }
    if (magnitude > largestMagnitude) {
        magnitude = largestMagnitude;
    }
    const UChar *patternString = patterns[getIndex(magnitude, plural)];
    if (patternString == nullptr && plural != StandardPlural::OTHER) {
        // Fall back to "other" plural variant
        patternString = patterns[getIndex(magnitude, StandardPlural::OTHER)];
    }
    if (patternString == USE_FALLBACK) { // == is intended
        // Return null if USE_FALLBACK is present
        patternString = nullptr;
    }
    return patternString;
}